

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

void do_actual_learning_ldf<true>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *this;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this_00;
  label_t *plVar1;
  undefined8 *puVar2;
  wclass **ppwVar3;
  uint uVar4;
  example *peVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  size_t sVar9;
  action_score *paVar10;
  pointer pvVar11;
  label_t lVar12;
  label_t lVar13;
  float *pfVar14;
  float *pfVar15;
  wclass *pwVar16;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *pvVar17;
  cbify *pcVar18;
  multi_learner *pmVar19;
  int iVar20;
  pointer ppeVar21;
  vw_exception *pvVar22;
  uint32_t uVar23;
  ulong uVar24;
  pointer pvVar25;
  ulong uVar26;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *__range1;
  long lVar27;
  float fVar28;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_224;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *local_220;
  cb_class local_218;
  cbify *local_208;
  multi_learner *local_200;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  local_220 = &data->cs_costs;
  this = &data->cb_costs;
  this_00 = &data->cb_as;
  local_208 = data;
  local_200 = base;
  std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>::
  resize(local_220,
         (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3);
  std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize
            (this,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3);
  std::
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ::resize(this_00,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_start >> 3);
  ppeVar21 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar21) {
    lVar27 = 0;
    uVar26 = 0;
    do {
      peVar5 = ppeVar21[uVar26];
      pvVar6 = (local_220->
               super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (peVar5->l).multi;
      lVar13 = (label_t)(peVar5->l).cs.costs._end;
      sVar9 = (peVar5->l).cs.costs.erase_count;
      puVar2 = (undefined8 *)((long)&pvVar6->end_array + lVar27);
      *puVar2 = (peVar5->l).cs.costs.end_array;
      puVar2[1] = sVar9;
      plVar1 = (label_t *)((long)&pvVar6->_begin + lVar27);
      *plVar1 = lVar12;
      plVar1[1] = lVar13;
      v_array<CB::cb_class>::clear
                ((v_array<CB::cb_class> *)
                 ((long)&((this->
                          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar27));
      v_array<ACTION_SCORE::action_score>::clear
                ((v_array<ACTION_SCORE::action_score> *)
                 ((long)&((this_00->
                          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar27));
      pvVar7 = (this->
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      plVar1 = (label_t *)((long)&pvVar7->_begin + lVar27);
      lVar12 = *plVar1;
      lVar13 = plVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar7->end_array + lVar27);
      sVar9 = puVar2[1];
      (peVar5->l).cs.costs.end_array = (wclass *)*puVar2;
      (peVar5->l).cs.costs.erase_count = sVar9;
      (peVar5->l).multi = lVar12;
      (peVar5->l).cs.costs._end = (wclass *)lVar13;
      pvVar8 = (this_00->
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)&pvVar8->_begin + lVar27);
      pfVar14 = (float *)*puVar2;
      pfVar15 = (float *)puVar2[1];
      puVar2 = (undefined8 *)((long)&pvVar8->end_array + lVar27);
      sVar9 = puVar2[1];
      (peVar5->pred).scalars.end_array = (float *)*puVar2;
      (peVar5->pred).scalars.erase_count = sVar9;
      (peVar5->pred).scalars._begin = pfVar14;
      (peVar5->pred).scalars._end = pfVar15;
      uVar26 = uVar26 + 1;
      ppeVar21 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar27 = lVar27 + 0x20;
    } while (uVar26 < (ulong)((long)(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar21 >> 3)
            );
  }
  pmVar19 = local_200;
  pvVar17 = local_220;
  (**(code **)(local_200 + 0x30))
            (*(undefined8 *)(local_200 + 0x18),*(undefined8 *)(local_200 + 0x20),ec_seq);
  pcVar18 = local_208;
  peVar5 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  sVar9 = local_208->example_counter;
  local_208->example_counter = sVar9 + 1;
  local_1b0 = (peVar5->pred).scalars._begin;
  local_218._8_8_ = *(undefined8 *)((long)&peVar5->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_218._0_8_ =
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar20 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar9 + local_208->app_seed,&local_1b8,&local_218,&local_224);
  if (iVar20 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar22 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar22,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x111,&local_1d8);
    __cxa_throw(pvVar22,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar10 = (peVar5->pred).a_s._begin;
  uVar4 = paVar10[local_224].action;
  uVar23 = uVar4 + 1;
  local_218.action = uVar23;
  local_218.probability = paVar10[local_224].score;
  if (uVar23 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar22 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar22,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x118,&local_1f8);
    __cxa_throw(pvVar22,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pvVar6 = (pcVar18->cs_costs).
           super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar11 = (pcVar18->cs_costs).
            super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar6 == pvVar11) {
    fVar28 = 0.0;
  }
  else {
    fVar28 = 0.0;
    do {
      pvVar25 = pvVar6 + 1;
      if (pvVar6->_begin->class_index == uVar23) {
        fVar28 = pvVar6->_begin->x;
        break;
      }
      pvVar6 = pvVar25;
    } while (pvVar25 != pvVar11);
  }
  local_218.cost = (pcVar18->loss1 - pcVar18->loss0) * fVar28 + pcVar18->loss0;
  v_array<CB::cb_class>::push_back
            ((v_array<CB::cb_class> *)
             &((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]->l).simple,&local_218);
  (**(code **)(pmVar19 + 0x28))
            (*(undefined8 *)(pmVar19 + 0x18),*(undefined8 *)(pmVar19 + 0x20),ec_seq);
  ppeVar21 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar21) {
    uVar26 = (ulong)(local_218.action - 1);
    uVar24 = 0;
    do {
      if (uVar26 == uVar24) {
        (ppeVar21[uVar24]->pred).multiclass = local_218.action;
        pvVar11 = (pvVar17->
                  super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar24];
        pvVar6 = pvVar11 + uVar26;
        lVar12 = (label_t)pvVar6->_begin;
        pwVar16 = pvVar6->_end;
        ppwVar3 = &pvVar11[uVar26].end_array;
        sVar9 = (size_t)ppwVar3[1];
        (peVar5->l).cs.costs.end_array = *ppwVar3;
        (peVar5->l).cs.costs.erase_count = sVar9;
        (peVar5->l).multi = lVar12;
        (peVar5->l).cs.costs._end = pwVar16;
      }
      else {
        (ppeVar21[uVar24]->pred).scalar = 0.0;
      }
      uVar24 = uVar24 + 1;
      ppeVar21 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)((long)(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar21 >> 3)
            );
  }
  return;
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  auto& cs_costs = data.cs_costs;
  auto& cb_costs = data.cb_costs;
  auto& cb_as = data.cb_as;

  // change label and pred data for cb
  cs_costs.resize(ec_seq.size());
  cb_costs.resize(ec_seq.size());
  cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    cs_costs[i] = ec.l.cs.costs;
    cb_costs[i].clear();
    cb_as[i].clear();
    ec.l.cb.costs = cb_costs[i];
    ec.pred.a_s = cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, cs_costs, cl.action);

  // add cb label to chosen action
  auto& lab = ec_seq[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    if (i == cl.action - 1)
    {
      ec_seq[i]->pred.multiclass = cl.action;
      ec_seq[i]->l.cs.costs = cs_costs[cl.action - 1]; // only need this cost for eval
    }
    else
      ec_seq[i]->pred.multiclass = 0;
  }
}